

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * __thiscall
kj::_::Debug::
makeDescription<char_const(&)[24],char_const*&,unsigned_long&,char_const*&,unsigned_short&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [24],
          char **params_1,unsigned_long *params_2,char **params_3,unsigned_short *params_4)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  char **params_00;
  unsigned_long *params_01;
  char **params_02;
  unsigned_short *params_03;
  long lVar4;
  ArrayPtr<kj::String> argValues;
  String SStack_a8;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[24]>(&SStack_a8,(kj *)macroArgs,(char (*) [24])macroArgs);
  str<char_const*&>(&local_90,(kj *)params,params_00);
  str<unsigned_long&>(&local_78,(kj *)params_1,params_01);
  str<char_const*&>(&local_60,(kj *)params_2,params_02);
  str<unsigned_short&>(&local_48,(kj *)params_3,params_03);
  argValues.size_ = 5;
  argValues.ptr = &SStack_a8;
  makeDescriptionInternal(__return_storage_ptr__,(char *)this,argValues);
  lVar4 = 0x60;
  do {
    lVar1 = *(long *)((long)&SStack_a8.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&SStack_a8.content.size_ + lVar4);
      *(undefined8 *)((long)&SStack_a8.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&SStack_a8.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&SStack_a8.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}